

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

SigHashType __thiscall
cfd::core::SigHashType::Create
          (SigHashType *this,uint8_t flag,bool is_append_anyone_can_pay,bool is_append_fork_id)

{
  undefined3 in_register_00000011;
  SigHashType *obj;
  SigHashType SVar1;
  
  SVar1._8_4_ = CONCAT31(in_register_00000011,is_append_anyone_can_pay);
  this->kSigHashForkId = '@';
  this->kSigHashRangeproof = '@';
  this->kSigHashAnyOneCanPay = 0x80;
  this->hash_algorithm_ = ((uint)(-1 < (char)flag) << 7 | 0x3f) & (uint)flag;
  this->is_anyone_can_pay_ = (bool)(flag >> 7);
  this->is_fork_id_ = (bool)(flag >> 6 & 1);
  if (SVar1._8_4_ != 0) {
    this->is_anyone_can_pay_ = true;
  }
  if (is_append_fork_id) {
    this->is_fork_id_ = true;
  }
  SVar1._0_8_ = this;
  return SVar1;
}

Assistant:

SigHashType SigHashType::Create(
    uint8_t flag, bool is_append_anyone_can_pay, bool is_append_fork_id) {
  SigHashType obj;
  obj.SetFromSigHashFlag(flag);
  if (is_append_anyone_can_pay) obj.is_anyone_can_pay_ = true;
  if (is_append_fork_id) obj.is_fork_id_ = true;
  return obj;
}